

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

String * Process::getEnvironmentVariable
                   (String *__return_storage_ptr__,String *name,String *defaultValue)

{
  char *pcVar1;
  usize length;
  
  pcVar1 = String::operator_cast_to_char_(name);
  pcVar1 = getenv(pcVar1);
  if (pcVar1 == (char *)0x0) {
    String::String(__return_storage_ptr__,defaultValue);
  }
  else {
    length = String::length(pcVar1);
    String::String(__return_storage_ptr__,pcVar1,length);
  }
  return __return_storage_ptr__;
}

Assistant:

String Process::getEnvironmentVariable(const String& name, const String& defaultValue)
{
#ifdef _WIN32
  String buffer;
  DWORD bufferSize = 256;
  for(;;)
  {
    buffer.resize(bufferSize);
    DWORD dw = GetEnvironmentVariable((const char*)name, (char*)buffer, bufferSize);
    if(dw >= bufferSize)
    {
      bufferSize <<= 1;
      continue;
    }
    if(!dw)
    {
      if (GetLastError() ==  ERROR_ENVVAR_NOT_FOUND)
        return defaultValue;
      return String();
    }
    buffer.resize(dw);
    return buffer;
  }
#else
  const char* var = getenv((const char*)name);
  if(!var)
    return defaultValue;
  return String(var, String::length(var));
#endif
}